

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcFx.c
# Opt level: O0

void Fx_ManCubeDoubleCubeDivisors
               (Fx_Man_t *p,int iFirst,Vec_Int_t *vPivot,int fRemove,int fUpdate,int *fWarning)

{
  Vec_Flt_t *pVVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  Vec_Int_t *p_00;
  int Value;
  int Base;
  int iDiv;
  int i;
  Vec_Int_t *vCube;
  int *fWarning_local;
  int fUpdate_local;
  int fRemove_local;
  Vec_Int_t *vPivot_local;
  int iFirst_local;
  Fx_Man_t *p_local;
  
  Base = iFirst;
  do {
    iVar2 = Vec_WecSize(p->vCubes);
    if (iVar2 <= Base) {
      return;
    }
    p_00 = Vec_WecEntry(p->vCubes,Base);
    iVar2 = Vec_IntSize(p_00);
    if (((iVar2 != 0) && (p_00 != vPivot)) &&
       ((iVar2 = Vec_WecIntHasMark(p_00), iVar2 == 0 ||
        ((iVar2 = Vec_WecIntHasMark(vPivot), iVar2 == 0 || (p_00 <= vPivot)))))) {
      iVar2 = Vec_IntEntry(p_00,0);
      iVar3 = Vec_IntEntry(vPivot,0);
      if (iVar2 != iVar3) {
        return;
      }
      iVar2 = Fx_ManDivFindCubeFree(p_00,vPivot,p->vCubeFree,fWarning);
      iVar3 = Vec_IntSize(p->vCubeFree);
      if (iVar3 == 4) {
        iVar3 = Fx_ManDivNormalize(p->vCubeFree);
        if (iVar3 == 0) {
          p->nDivMux[0] = p->nDivMux[0] + 1;
        }
        else if (iVar3 == 1) {
          p->nDivMux[1] = p->nDivMux[1] + 1;
        }
        else {
          p->nDivMux[2] = p->nDivMux[2] + 1;
        }
        if ((p->fCanonDivs != 0) && (iVar3 < 0)) goto LAB_002b8549;
      }
      if (((p->LitCountMax == 0) ||
          (iVar3 = p->LitCountMax, iVar4 = Vec_IntSize(p->vCubeFree), iVar4 <= iVar3)) &&
         ((p->fCanonDivs == 0 || (iVar3 = Vec_IntSize(p->vCubeFree), iVar3 != 3)))) {
        iVar3 = Hsh_VecManAdd(p->pHash,p->vCubeFree);
        if (fRemove == 0) {
          iVar4 = Vec_FltSize(p->vWeights);
          if (iVar3 == iVar4) {
            pVVar1 = p->vWeights;
            iVar4 = Vec_IntSize(p->vCubeFree);
            iVar5 = Fx_ManComputeLevelDiv(p,p->vCubeFree);
            Vec_FltPush(pVVar1,(float)iVar5 * -0.0009 + (float)-iVar4 + 0.9);
          }
          iVar4 = Vec_FltSize(p->vWeights);
          if (iVar4 <= iVar3) {
            __assert_fail("iDiv < Vec_FltSize(p->vWeights)",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abci/abcFx.c"
                          ,0x359,
                          "void Fx_ManCubeDoubleCubeDivisors(Fx_Man_t *, int, Vec_Int_t *, int, int, int *)"
                         );
          }
          pVVar1 = p->vWeights;
          iVar4 = Vec_IntSize(p->vCubeFree);
          Vec_FltAddToEntry(pVVar1,iVar3,(float)(iVar2 + iVar4 + -1));
          p->nPairsD = p->nPairsD + 1;
        }
        else {
          iVar4 = Vec_FltSize(p->vWeights);
          if (iVar4 <= iVar3) {
            __assert_fail("iDiv < Vec_FltSize(p->vWeights)",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abci/abcFx.c"
                          ,0x35f,
                          "void Fx_ManCubeDoubleCubeDivisors(Fx_Man_t *, int, Vec_Int_t *, int, int, int *)"
                         );
          }
          pVVar1 = p->vWeights;
          iVar4 = Vec_IntSize(p->vCubeFree);
          Vec_FltAddToEntry(pVVar1,iVar3,(float)-(iVar2 + iVar4 + -1));
          p->nPairsD = p->nPairsD + -1;
        }
        if (fUpdate != 0) {
          iVar2 = Vec_QueIsMember(p->vPrio,iVar3);
          if (iVar2 == 0) {
            if (fRemove == 0) {
              Vec_QuePush(p->vPrio,iVar3);
            }
          }
          else {
            Vec_QueUpdate(p->vPrio,iVar3);
          }
        }
      }
    }
LAB_002b8549:
    Base = Base + 1;
  } while( true );
}

Assistant:

void Fx_ManCubeDoubleCubeDivisors( Fx_Man_t * p, int iFirst, Vec_Int_t * vPivot, int fRemove, int fUpdate, int * fWarning )
{
    Vec_Int_t * vCube;
    int i, iDiv, Base;
    Vec_WecForEachLevelStart( p->vCubes, vCube, i, iFirst )
    {
        if ( Vec_IntSize(vCube) == 0 || vCube == vPivot )
            continue;
        if ( Vec_WecIntHasMark(vCube) && Vec_WecIntHasMark(vPivot) && vCube > vPivot )
            continue;
        if ( Vec_IntEntry(vCube, 0) != Vec_IntEntry(vPivot, 0) )
            break;
        Base = Fx_ManDivFindCubeFree( vCube, vPivot, p->vCubeFree, fWarning );
        if ( Vec_IntSize(p->vCubeFree) == 4 )
        { 
            int Value = Fx_ManDivNormalize( p->vCubeFree );
            if ( Value == 0 )
                p->nDivMux[0]++;
            else if ( Value == 1 )
                p->nDivMux[1]++;
            else
                p->nDivMux[2]++;
            if ( p->fCanonDivs && Value < 0 )
                continue;
        }
        if ( p->LitCountMax && p->LitCountMax < Vec_IntSize(p->vCubeFree) )
            continue;
        if ( p->fCanonDivs && Vec_IntSize(p->vCubeFree) == 3 )
            continue;
        iDiv = Hsh_VecManAdd( p->pHash, p->vCubeFree );
        if ( !fRemove )
        {
            if ( iDiv == Vec_FltSize(p->vWeights) )
                Vec_FltPush(p->vWeights, -Vec_IntSize(p->vCubeFree) + 0.9 - 0.0009 * Fx_ManComputeLevelDiv(p, p->vCubeFree));
            assert( iDiv < Vec_FltSize(p->vWeights) );
            Vec_FltAddToEntry( p->vWeights, iDiv, Base + Vec_IntSize(p->vCubeFree) - 1 );
            p->nPairsD++;
        }
        else
        {
            assert( iDiv < Vec_FltSize(p->vWeights) );
            Vec_FltAddToEntry( p->vWeights, iDiv, -(Base + Vec_IntSize(p->vCubeFree) - 1) );
            p->nPairsD--;
        }
        if ( fUpdate )
        {
            if ( Vec_QueIsMember(p->vPrio, iDiv) )
                Vec_QueUpdate( p->vPrio, iDiv );
            else if ( !fRemove )
                Vec_QuePush( p->vPrio, iDiv );
        }
    } 
}